

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpinternalsourcedata.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPInternalSourceData::ProcessPrivateSDESItem
          (RTPInternalSourceData *this,uint8_t *prefix,size_t prefixlen,uint8_t *value,
          size_t valuelen,RTPTime *receivetime)

{
  int status;
  RTPTime *receivetime_local;
  size_t valuelen_local;
  uint8_t *value_local;
  size_t prefixlen_local;
  uint8_t *prefix_local;
  RTPInternalSourceData *this_local;
  
  RTPSourceStats::SetLastMessageTime(&(this->super_RTPSourceData).stats,receivetime);
  this_local._4_4_ =
       RTCPSDESInfo::SetPrivateValue
                 (&(this->super_RTPSourceData).SDESinf,prefix,prefixlen,value,valuelen);
  if (this_local._4_4_ == -0x38) {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int RTPInternalSourceData::ProcessPrivateSDESItem(const uint8_t *prefix,size_t prefixlen,const uint8_t *value,size_t valuelen,const RTPTime &receivetime)
{
	int status;
	
	stats.SetLastMessageTime(receivetime);
	status = SDESinf.SetPrivateValue(prefix,prefixlen,value,valuelen);
	if (status == ERR_RTP_SDES_MAXPRIVITEMS)
		return 0; // don't stop processing just because the number of items is full
	return status;
}